

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
atoiTest_testStrangeNumbers_Test::~atoiTest_testStrangeNumbers_Test
          (atoiTest_testStrangeNumbers_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(atoiTest, testStrangeNumbers) {
  test<int64_t>(int64_t(0), "00"); 
  test<int64_t>(int64_t(0), "00000000000000000000000000000"); 
  test<int64_t>(int64_t(1), "01"); 
  test<int64_t>(int64_t(0), "-0"); 
  test<int64_t>(int64_t(-1), "-01"); 
  test<int64_t>(int64_t(-10), "-010"); 
  test<int64_t>(int64_t(0), "-00000"); 
  test<int64_t>(int64_t(-2), "-000002"); 
  test<int64_t>(int64_t(0), "+0"); 
  test<int64_t>(int64_t(0), "+00"); 
  test<int64_t>(int64_t(10), "+010"); 
  test<int64_t>(int64_t(0), "+00000000"); 
  test<int64_t>(int64_t(2), "+000000002"); 
  test<int64_t>(int64_t(0), "+0000000000000000000000000000000000000000"); 
  test<int64_t>(int64_t(22), "+000000000000000000000000000000000000000022"); 
}